

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HatchetRegionProfileController.cpp
# Opt level: O0

string * __thiscall
(anonymous_namespace)::check_args_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Options *opts)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e8;
  allocator<char> local_179;
  undefined4 local_178;
  allocator<char> local_171;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  _Self local_130;
  _Self local_128;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_11a;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_119;
  undefined1 local_118;
  allocator<char> local_117;
  allocator<char> local_116;
  allocator<char> local_115 [20];
  allocator<char> local_101;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  iterator local_78;
  size_type local_70;
  undefined1 local_68 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allowed_formats;
  string format;
  Options *opts_local;
  
  cali::ConfigManager::Options::get_abi_cxx11_
            ((string *)&allowed_formats._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (Options *)this,"output.format","cali");
  local_118 = 1;
  local_100 = &local_f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"cali",&local_101);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d8,"json",local_115);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b8,"json-split",&local_116);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_98,"hatchet",&local_117);
  local_118 = 0;
  local_78 = &local_f8;
  local_70 = 4;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_11a);
  __l._M_len = local_70;
  __l._M_array = local_78;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_68,__l,&local_119,&local_11a);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_11a);
  local_1e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_78;
  do {
    local_1e8 = local_1e8 + -1;
    std::__cxx11::string::~string((string *)local_1e8);
  } while (local_1e8 != &local_f8);
  std::allocator<char>::~allocator(&local_117);
  std::allocator<char>::~allocator(&local_116);
  std::allocator<char>::~allocator(local_115);
  std::allocator<char>::~allocator(&local_101);
  local_128._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_68,
              (key_type *)&allowed_formats._M_t._M_impl.super__Rb_tree_header._M_node_count);
  local_130._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_68);
  bVar1 = std::operator==(&local_128,&local_130);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_170,"rocm-activity-profile: Invalid output format \"",&local_171);
    std::operator+(&local_150,&local_170,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &allowed_formats._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::operator+(__return_storage_ptr__,&local_150,"\"");
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    std::allocator<char>::~allocator(&local_171);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_179);
    std::allocator<char>::~allocator(&local_179);
  }
  local_178 = 1;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_68);
  std::__cxx11::string::~string
            ((string *)&allowed_formats._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return __return_storage_ptr__;
}

Assistant:

std::string check_args(const cali::ConfigManager::Options& opts)
{
    // Check if output.format is valid

    std::string           format          = opts.get("output.format", "json-split");
    std::set<std::string> allowed_formats = { "cali", "json", "json-split", "hatchet" };

    if (allowed_formats.find(format) == allowed_formats.end())
        return std::string("hatchet-region-profile: Invalid output format \"") + format + "\"";

    return "";
}